

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_buf.c
# Opt level: O0

SBuf * lj_buf_puttab(SBuf *sb,GCtab *t,GCstr *sep,int32_t i,int32_t e)

{
  uint uVar1;
  SBuf *sb_00;
  cTValue *local_b8;
  uint local_b0;
  char *pcStack_a8;
  MSize len;
  char *w;
  cTValue *o;
  MSize seplen;
  int32_t e_local;
  int32_t i_local;
  GCstr *sep_local;
  GCtab *t_local;
  SBuf *sb_local;
  char *local_58;
  char *local_40;
  
  if (sep == (GCstr *)0x0) {
    local_b0 = 0;
  }
  else {
    local_b0 = sep->len;
  }
  seplen = i;
  if (e < i) {
    return sb;
  }
  while( true ) {
    if (seplen < t->asize) {
      local_b8 = (cTValue *)((t->array).ptr64 + (long)(int)seplen * 8);
    }
    else {
      local_b8 = lj_tab_getinth(t,seplen);
    }
    if (local_b8 == (cTValue *)0x0) break;
    if ((int)(local_b8->field_4).it >> 0xf == -5) {
      uVar1 = *(uint *)((local_b8->u64 & 0x7fffffffffff) + 0x14);
      if ((uint)((int)sb->e - (int)sb->w) < uVar1 + local_b0) {
        local_40 = lj_buf_more2(sb,uVar1 + local_b0);
      }
      else {
        local_40 = sb->w;
      }
      memcpy(local_40,(void *)((local_b8->u64 & 0x7fffffffffff) + 0x18),(ulong)uVar1);
      pcStack_a8 = local_40 + uVar1;
    }
    else {
      if (0xfffffff1 < (uint)((int)(local_b8->field_4).it >> 0xf)) break;
      sb_00 = lj_strfmt_putfnum(sb,0xf000035,local_b8->n);
      if ((uint)((int)sb_00->e - (int)sb_00->w) < local_b0) {
        local_58 = lj_buf_more2(sb_00,local_b0);
      }
      else {
        local_58 = sb_00->w;
      }
      pcStack_a8 = local_58;
    }
    if (seplen == e) {
      sb->w = pcStack_a8;
      return sb;
    }
    if (local_b0 != 0) {
      memcpy(pcStack_a8,sep + 1,(ulong)local_b0);
      pcStack_a8 = pcStack_a8 + local_b0;
    }
    sb->w = pcStack_a8;
    seplen = seplen + 1;
  }
  sb->w = (char *)(long)(int)seplen;
  return (SBuf *)0x0;
}

Assistant:

SBuf *lj_buf_puttab(SBuf *sb, GCtab *t, GCstr *sep, int32_t i, int32_t e)
{
  MSize seplen = sep ? sep->len : 0;
  if (i <= e) {
    for (;;) {
      cTValue *o = lj_tab_getint(t, i);
      char *w;
      if (!o) {
      badtype:  /* Error: bad element type. */
	sb->w = (char *)(intptr_t)i;  /* Store failing index. */
	return NULL;
      } else if (tvisstr(o)) {
	MSize len = strV(o)->len;
	w = lj_buf_wmem(lj_buf_more(sb, len + seplen), strVdata(o), len);
      } else if (tvisint(o)) {
	w = lj_strfmt_wint(lj_buf_more(sb, STRFMT_MAXBUF_INT+seplen), intV(o));
      } else if (tvisnum(o)) {
	w = lj_buf_more(lj_strfmt_putfnum(sb, STRFMT_G14, numV(o)), seplen);
      } else {
	goto badtype;
      }
      if (i++ == e) {
	sb->w = w;
	break;
      }
      if (seplen) w = lj_buf_wmem(w, strdata(sep), seplen);
      sb->w = w;
    }
  }
  return sb;
}